

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_ffrecord.c
# Opt level: O1

void recff_buffer_method_get(jit_State *J,RecordFFData *rd)

{
  TRef *pTVar1;
  long lVar2;
  TRef TVar3;
  TRef TVar4;
  uint uVar5;
  TRef TVar6;
  IRRef1 IVar7;
  IRRef1 IVar8;
  IRRef1 IVar9;
  long lVar10;
  
  TVar3 = recff_sbufx_check(J,rd,0);
  IVar8 = (IRRef1)TVar3;
  (J->fold).ins.field_0.op1 = IVar8;
  *(undefined4 *)((long)&(J->fold).ins.field_1.op12 + 2) = 0x45090013;
  TVar3 = lj_opt_fold(J);
  (J->fold).ins.field_0.op1 = IVar8;
  *(undefined4 *)((long)&(J->fold).ins.field_1.op12 + 2) = 0x4509000e;
  TVar4 = lj_opt_fold(J);
  pTVar1 = J->base;
  if (pTVar1[1] == 0) {
    pTVar1[1] = 0x7fff;
    pTVar1[2] = 0;
  }
  uVar5 = J->base[1];
  if (uVar5 != 0) {
    lVar10 = 1;
    do {
      if ((uVar5 & 0x1f000000) != 0) {
        TVar6 = recff_sbufx_checkint(J,rd,lVar10);
        J->base[lVar10] = TVar6;
      }
      uVar5 = J->base[lVar10 + 1];
      lVar10 = lVar10 + 1;
    } while (uVar5 != 0);
  }
  lVar10 = 0;
  TVar6 = J->base[1];
  while (TVar6 != 0) {
    (J->fold).ins.field_0.ot = 0x2a15;
    (J->fold).ins.field_0.op1 = (IRRef1)TVar4;
    IVar9 = (IRRef1)TVar3;
    (J->fold).ins.field_0.op2 = IVar9;
    TVar3 = lj_opt_fold(J);
    (J->fold).ins.field_0.op1 = (IRRef1)TVar3;
    *(undefined4 *)((long)&(J->fold).ins.field_1.op12 + 2) = 0x5b131275;
    TVar3 = lj_opt_fold(J);
    IVar7 = (IRRef1)TVar3;
    TVar3 = TVar4;
    if ((TVar6 & 0x1f000000) != 0) {
      (J->fold).ins.field_0.ot = 0x3213;
      (J->fold).ins.field_0.op1 = IVar7;
      (J->fold).ins.field_0.op2 = (IRRef1)TVar6;
      TVar3 = lj_opt_fold(J);
      (J->fold).ins.field_0.ot = 0x2909;
      (J->fold).ins.field_0.op1 = IVar9;
      IVar7 = (IRRef1)TVar3;
      (J->fold).ins.field_0.op2 = IVar7;
      TVar3 = lj_opt_fold(J);
    }
    (J->fold).ins.field_0.ot = 0x5004;
    (J->fold).ins.field_0.op1 = IVar9;
    (J->fold).ins.field_0.op2 = IVar7;
    TVar6 = lj_opt_fold(J);
    J->base[lVar10] = TVar6;
    (J->fold).ins.field_0.op1 = IVar8;
    *(undefined4 *)((long)&(J->fold).ins.field_1.op12 + 2) = 0x3e090013;
    TVar6 = lj_opt_fold(J);
    (J->fold).ins.field_0.ot = 0x4d09;
    (J->fold).ins.field_0.op1 = (IRRef1)TVar6;
    (J->fold).ins.field_0.op2 = (IRRef1)TVar3;
    lj_opt_fold(J);
    lVar2 = lVar10 + 2;
    lVar10 = lVar10 + 1;
    TVar6 = J->base[lVar2];
  }
  rd->nres = lVar10;
  return;
}

Assistant:

static void LJ_FASTCALL recff_buffer_method_get(jit_State *J, RecordFFData *rd)
{
  TRef ud = recff_sbufx_check(J, rd, 0);
  TRef trr = recff_sbufx_get_ptr(J, ud, IRFL_SBUF_R);
  TRef trw = recff_sbufx_get_ptr(J, ud, IRFL_SBUF_W);
  TRef tr;
  ptrdiff_t arg;
  if (!J->base[1]) { J->base[1] = TREF_NIL; J->base[2] = 0; }
  for (arg = 0; (tr = J->base[arg+1]); arg++) {
    if (!tref_isnil(tr)) {
      J->base[arg+1] = recff_sbufx_checkint(J, rd, arg+1);
    }
  }
  for (arg = 0; (tr = J->base[arg+1]); arg++) {
    TRef len = recff_sbufx_len(J, trr, trw);
    if (tref_isnil(tr)) {
      J->base[arg] = emitir(IRT(IR_XSNEW, IRT_STR), trr, len);
      trr = trw;
    } else {
      TRef tru;
      len = emitir(IRTI(IR_MIN), len, tr);
      tru = emitir(IRT(IR_ADD, IRT_PTR), trr, len);
      J->base[arg] = emitir(IRT(IR_XSNEW, IRT_STR), trr, len);
      trr = tru;  /* Doing the ADD before the SNEW generates better code. */
    }
    recff_sbufx_set_ptr(J, ud, IRFL_SBUF_R, trr);
  }
  rd->nres = arg;
}